

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall
Lowerer::TryGenerateFastBrOrCmTypeOf
          (Lowerer *this,Instr *instr,Instr **prev,bool isNeqOp,bool *pfNoLower)

{
  code *pcVar1;
  bool bVar2;
  OpCode OVar3;
  charcount_t length;
  undefined4 *puVar4;
  Opnd *pOVar5;
  AddrOpnd *pAVar6;
  JITJavascriptString *this_00;
  char16 *content;
  RegOpnd *pRVar7;
  StackSym *pSVar8;
  Instr *pIVar9;
  BranchInstr *this_01;
  LabelInstr *target;
  Opnd *pOVar10;
  LibraryValue valueType;
  bool bVar11;
  RegOpnd *local_e8;
  IntConstOpnd *local_e0;
  IntConstOpnd *local_d8;
  Instr *hoistInstr_1;
  Instr *hoistInstr;
  Opnd *objectOpnd;
  Opnd *typeOfSrc;
  InternalString typeNameString;
  char16 *typeName;
  JITJavascriptString *typeNameJsString;
  IntConstOpnd *typeIdOpnd;
  RegOpnd *idOpnd;
  RegOpnd *typeOpnd;
  RegOpnd *typeOfDst;
  RegOpnd *instrSrc2;
  RegOpnd *instrSrc1;
  Instr *typeOf;
  Instr *pIStack_40;
  bool skippedLoads;
  Instr *instrLd;
  bool *pfNoLower_local;
  bool isNeqOp_local;
  Instr **prev_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  if (prev == (Instr **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6172,"(prev)","prev");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (((((((instr->m_opcode != BrSrEq_A) && (instr->m_opcode != BrSrNeq_A)) &&
         (instr->m_opcode != BrSrNotEq_A)) &&
        ((instr->m_opcode != BrSrNotNeq_A && (instr->m_opcode != CmSrEq_A)))) &&
       ((instr->m_opcode != CmSrNeq_A &&
        ((instr->m_opcode != BrEq_A && (instr->m_opcode != BrNeq_A)))))) &&
      (instr->m_opcode != BrNotEq_A)) &&
     (((instr->m_opcode != BrNotNeq_A && (instr->m_opcode != CmEq_A)) &&
      (instr->m_opcode != CmNeq_A)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x617e,
                       "(instr->m_opcode == Js::OpCode::BrSrEq_A || instr->m_opcode == Js::OpCode::BrSrNeq_A || instr->m_opcode == Js::OpCode::BrSrNotEq_A || instr->m_opcode == Js::OpCode::BrSrNotNeq_A || instr->m_opcode == Js::OpCode::CmSrEq_A || instr->m_opcode == Js::OpCode::CmSrNeq_A || instr->m_opcode == Js::OpCode::BrEq_A || instr->m_opcode == Js::OpCode::BrNeq_A || instr->m_opcode == Js::OpCode::BrNotEq_A || instr->m_opcode == Js::OpCode::BrNotNeq_A || instr->m_opcode == Js::OpCode::CmEq_A || instr->m_opcode == Js::OpCode::CmNeq_A)"
                       ,
                       "instr->m_opcode == Js::OpCode::BrSrEq_A || instr->m_opcode == Js::OpCode::BrSrNeq_A || instr->m_opcode == Js::OpCode::BrSrNotEq_A || instr->m_opcode == Js::OpCode::BrSrNotNeq_A || instr->m_opcode == Js::OpCode::CmSrEq_A || instr->m_opcode == Js::OpCode::CmSrNeq_A || instr->m_opcode == Js::OpCode::BrEq_A || instr->m_opcode == Js::OpCode::BrNeq_A || instr->m_opcode == Js::OpCode::BrNotEq_A || instr->m_opcode == Js::OpCode::BrNotNeq_A || instr->m_opcode == Js::OpCode::CmEq_A || instr->m_opcode == Js::OpCode::CmNeq_A"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pIStack_40 = IR::Instr::GetPrevRealInstrOrLabel(instr);
  bVar2 = false;
  while( true ) {
    pIVar9 = pIStack_40;
    bVar11 = false;
    if (pIStack_40 != (Instr *)0x0) {
      bVar11 = pIStack_40->m_opcode == Ld_A;
    }
    if (!bVar11) break;
    pOVar5 = IR::Instr::GetDst(pIStack_40);
    bVar2 = IR::Opnd::IsRegOpnd(pOVar5);
    if (!bVar2) {
      return false;
    }
    pOVar5 = IR::Instr::GetDst(pIStack_40);
    pRVar7 = IR::Opnd::AsRegOpnd(pOVar5);
    if (((byte)pRVar7->field_0x18 >> 3 & 1) == 0) {
      return false;
    }
    bVar2 = IR::Instr::HasBailOutInfo(pIStack_40);
    if (bVar2) {
      return false;
    }
    pIStack_40 = IR::Instr::GetPrevRealInstrOrLabel(pIStack_40);
    bVar2 = true;
  }
  pOVar5 = IR::Instr::GetSrc1(instr);
  bVar11 = IR::Opnd::IsRegOpnd(pOVar5);
  if (bVar11) {
    pOVar5 = IR::Instr::GetSrc1(instr);
    local_d8 = (IntConstOpnd *)IR::Opnd::AsRegOpnd(pOVar5);
  }
  else {
    local_d8 = (IntConstOpnd *)0x0;
  }
  instrSrc2 = (RegOpnd *)local_d8;
  pOVar5 = IR::Instr::GetSrc2(instr);
  bVar11 = IR::Opnd::IsRegOpnd(pOVar5);
  if (bVar11) {
    pOVar5 = IR::Instr::GetSrc2(instr);
    local_e0 = (IntConstOpnd *)IR::Opnd::AsRegOpnd(pOVar5);
  }
  else {
    local_e0 = (IntConstOpnd *)0x0;
  }
  typeOfDst = (RegOpnd *)local_e0;
  if ((pIStack_40 != (Instr *)0x0) && (pIStack_40->m_opcode == Typeof)) {
    pOVar5 = IR::Instr::GetDst(pIStack_40);
    bVar11 = IR::Opnd::IsRegOpnd(pOVar5);
    if (bVar11) {
      pOVar5 = IR::Instr::GetDst(pIStack_40);
      local_e8 = IR::Opnd::AsRegOpnd(pOVar5);
    }
    else {
      local_e8 = (RegOpnd *)0x0;
    }
    if (((local_e8 != (RegOpnd *)0x0) && (local_d8 != (IntConstOpnd *)0x0)) &&
       (local_e0 != (IntConstOpnd *)0x0)) {
      if ((StackSym *)(local_d8->super_EncodableOpnd<long>).m_value == local_e8->m_sym) {
        idOpnd = (RegOpnd *)local_d8;
        typeIdOpnd = local_e0;
      }
      else {
        if ((StackSym *)(local_e0->super_EncodableOpnd<long>).m_value != local_e8->m_sym)
        goto LAB_007cc8e5;
        idOpnd = (RegOpnd *)local_e0;
        typeIdOpnd = local_d8;
      }
      if ((idOpnd->field_0x18 & 1) != 0) {
        if (((*(uint *)((typeIdOpnd->super_EncodableOpnd<long>).m_value + 0x18) & 1) == 0) ||
           ((*(uint *)((typeIdOpnd->super_EncodableOpnd<long>).m_value + 0x18) >> 10 & 1) == 0)) {
          return false;
        }
        if ((*(uint *)((typeIdOpnd->super_EncodableOpnd<long>).m_value + 0x18) & 1) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar11 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                              ,0x61c0,"(idOpnd->m_sym->m_isSingleDef)",
                              "idOpnd->m_sym->m_isSingleDef");
          if (!bVar11) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        pOVar5 = IR::Instr::GetSrc1(*(Instr **)
                                     ((typeIdOpnd->super_EncodableOpnd<long>).m_value + 0x28));
        bVar11 = IR::Opnd::IsAddrOpnd(pOVar5);
        if (!bVar11) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar11 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                              ,0x61c1,"(idOpnd->m_sym->m_instrDef->GetSrc1()->IsAddrOpnd())",
                              "idOpnd->m_sym->m_instrDef->GetSrc1()->IsAddrOpnd()");
          if (!bVar11) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        pOVar5 = IR::Instr::GetSrc1(*(Instr **)
                                     ((typeIdOpnd->super_EncodableOpnd<long>).m_value + 0x28));
        pAVar6 = IR::Opnd::AsAddrOpnd(pOVar5);
        this_00 = JITJavascriptString::FromVar(pAVar6->m_localAddress);
        content = JITJavascriptString::GetString(this_00);
        typeNameString.m_content.ptr = content;
        length = JITJavascriptString::GetLength(this_00);
        Js::InternalString::InternalString((InternalString *)&typeOfSrc,content,length,'\0');
        bVar11 = Js::InternalStringComparer::Equals
                           ((InternalString *)&typeOfSrc,
                            (InternalString *)Js::Type::UndefinedTypeNameString);
        if (bVar11) {
          typeNameJsString =
               (JITJavascriptString *)IR::IntConstOpnd::New(0,TyInt32,instr->m_func,false);
        }
        else {
          bVar11 = Js::InternalStringComparer::Equals
                             ((InternalString *)&typeOfSrc,
                              (InternalString *)Js::Type::ObjectTypeNameString);
          if (bVar11) {
            typeNameJsString =
                 (JITJavascriptString *)IR::IntConstOpnd::New(0x1c,TyInt32,instr->m_func,false);
          }
          else {
            bVar11 = Js::InternalStringComparer::Equals
                               ((InternalString *)&typeOfSrc,
                                (InternalString *)Js::Type::BooleanTypeNameString);
            if (bVar11) {
              typeNameJsString =
                   (JITJavascriptString *)IR::IntConstOpnd::New(2,TyInt32,instr->m_func,false);
            }
            else {
              bVar11 = Js::InternalStringComparer::Equals
                                 ((InternalString *)&typeOfSrc,
                                  (InternalString *)Js::Type::NumberTypeNameString);
              if (bVar11) {
                typeNameJsString =
                     (JITJavascriptString *)IR::IntConstOpnd::New(4,TyInt32,instr->m_func,false);
              }
              else {
                bVar11 = Js::InternalStringComparer::Equals
                                   ((InternalString *)&typeOfSrc,
                                    (InternalString *)Js::Type::StringTypeNameString);
                if (bVar11) {
                  typeNameJsString =
                       (JITJavascriptString *)IR::IntConstOpnd::New(7,TyInt32,instr->m_func,false);
                }
                else {
                  bVar11 = Js::InternalStringComparer::Equals
                                     ((InternalString *)&typeOfSrc,
                                      (InternalString *)Js::Type::FunctionTypeNameString);
                  if (!bVar11) {
                    return false;
                  }
                  typeNameJsString =
                       (JITJavascriptString *)
                       IR::IntConstOpnd::New(0x1b,TyInt32,instr->m_func,false);
                }
              }
            }
          }
        }
        if (bVar2) {
          pOVar5 = IR::Instr::GetSrc1(pIStack_40);
          for (pIStack_40 = IR::Instr::GetNextRealInstr(pIStack_40); pIStack_40 != instr;
              pIStack_40 = IR::Instr::GetNextRealInstr(pIStack_40)) {
            pOVar10 = IR::Instr::GetDst(pIStack_40);
            bVar2 = IR::Opnd::IsEqual(pOVar10,&local_e8->super_Opnd);
            if (bVar2) {
              return false;
            }
            pOVar10 = IR::Instr::GetDst(pIStack_40);
            bVar2 = IR::Opnd::IsEqual(pOVar10,pOVar5);
            if (bVar2) {
              return false;
            }
          }
          IR::Instr::Unlink(pIVar9);
          IR::Instr::InsertBefore(instr,pIVar9);
        }
        pOVar5 = IR::Instr::GetSrc1(pIVar9);
        bVar2 = IR::Opnd::IsRegOpnd(pOVar5);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x61f7,"(objectOpnd->IsRegOpnd())","objectOpnd->IsRegOpnd()");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        *prev = pIVar9->m_prev;
        *pfNoLower = false;
        bVar2 = IR::Instr::IsBranchInstr(instr);
        if (bVar2) {
          pRVar7 = IR::Opnd::AsRegOpnd(pOVar5);
          GenerateFastBrTypeOf
                    (this,instr,pRVar7,(IntConstOpnd *)typeNameJsString,pIVar9,pfNoLower,isNeqOp);
        }
        else {
          pRVar7 = IR::Opnd::AsRegOpnd(pOVar5);
          GenerateFastCmTypeOf
                    (this,instr,pRVar7,(IntConstOpnd *)typeNameJsString,pIVar9,pfNoLower,isNeqOp);
        }
        return true;
      }
    }
  }
LAB_007cc8e5:
  if (local_d8 != (IntConstOpnd *)0x0) {
    pSVar8 = IR::Opnd::GetStackSym(&local_d8->super_Opnd);
    bVar2 = StackSym::IsSingleDef(pSVar8);
    if (!bVar2) {
      return false;
    }
    if (local_e0 == (IntConstOpnd *)0x0) {
      return false;
    }
    pSVar8 = IR::Opnd::GetStackSym(&local_e0->super_Opnd);
    bVar2 = StackSym::IsSingleDef(pSVar8);
    if (!bVar2) {
      return false;
    }
    pSVar8 = IR::Opnd::GetStackSym(&local_d8->super_Opnd);
    pIVar9 = StackSym::GetInstrDef(pSVar8);
    if (pIVar9->m_opcode == Typeof) {
      pSVar8 = IR::Opnd::GetStackSym(&local_e0->super_Opnd);
      pIVar9 = StackSym::GetInstrDef(pSVar8);
      if (pIVar9->m_opcode == Typeof) goto LAB_007cc9c2;
      pSVar8 = IR::Opnd::GetStackSym(&local_e0->super_Opnd);
      bVar2 = StackSym::GetIsStrConst(pSVar8);
      if (bVar2) goto LAB_007cc9c2;
    }
    pSVar8 = IR::Opnd::GetStackSym(&local_e0->super_Opnd);
    pIVar9 = StackSym::GetInstrDef(pSVar8);
    if (pIVar9->m_opcode == Typeof) {
      pSVar8 = IR::Opnd::GetStackSym(&local_d8->super_Opnd);
      pIVar9 = StackSym::GetInstrDef(pSVar8);
      if (pIVar9->m_opcode != Typeof) {
        pSVar8 = IR::Opnd::GetStackSym(&local_d8->super_Opnd);
        bVar2 = StackSym::GetIsStrConst(pSVar8);
        if (!bVar2) {
          return false;
        }
      }
LAB_007cc9c2:
      *pfNoLower = true;
      bVar2 = IR::Instr::IsBranchInstr(instr);
      if (bVar2) {
        OVar3 = BrEq_A;
        if (isNeqOp) {
          OVar3 = BrNeq_A;
        }
        this_01 = IR::Instr::AsBranchInstr(instr);
        target = IR::BranchInstr::GetTarget(this_01);
        InsertCompareBranch(this,&local_d8->super_Opnd,&local_e0->super_Opnd,OVar3,target,instr,
                            false);
        IR::Instr::Remove(instr);
      }
      else {
        bVar2 = IR::Opnd::IsEqual(&local_d8->super_Opnd,&local_e0->super_Opnd);
        if (bVar2) {
          pOVar5 = IR::Instr::GetDst(instr);
          valueType = ValueTrue;
          if (isNeqOp) {
            valueType = ValueFalse;
          }
          pOVar10 = LoadLibraryValueOpnd(this,instr,valueType);
          InsertMove(pOVar5,pOVar10,instr,true);
        }
        else {
          pOVar5 = IR::Instr::GetDst(instr);
          bVar2 = IR::Opnd::IsEqual(pOVar5,&local_d8->super_Opnd);
          if (bVar2) {
            pIVar9 = IR::Instr::HoistSrc1(instr,Ld_A,RegNOREG,(StackSym *)0x0);
            pIVar9 = LowererMD::ChangeToAssign(pIVar9);
            pOVar5 = IR::Instr::GetDst(pIVar9);
            instrSrc2 = IR::Opnd::AsRegOpnd(pOVar5);
          }
          pOVar5 = IR::Instr::GetDst(instr);
          bVar2 = IR::Opnd::IsEqual(pOVar5,&local_e0->super_Opnd);
          if (bVar2) {
            pIVar9 = IR::Instr::HoistSrc2(instr,Ld_A,RegNOREG,(StackSym *)0x0);
            pIVar9 = LowererMD::ChangeToAssign(pIVar9);
            pOVar5 = IR::Instr::GetDst(pIVar9);
            typeOfDst = IR::Opnd::AsRegOpnd(pOVar5);
          }
          pOVar5 = IR::Instr::GetDst(instr);
          pOVar10 = LoadLibraryValueOpnd(this,instr,ValueTrue);
          InsertMove(pOVar5,pOVar10,instr,true);
          InsertCompare(&instrSrc2->super_Opnd,&typeOfDst->super_Opnd,instr);
          OVar3 = CMOVNE;
          if (isNeqOp) {
            OVar3 = CMOVE;
          }
          pOVar5 = IR::Instr::GetDst(instr);
          pOVar10 = LoadLibraryValueOpnd(this,instr,ValueFalse);
          LowererMD::InsertCmovCC(OVar3,pOVar5,pOVar10,instr,false);
        }
        IR::Instr::Remove(instr);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool
Lowerer::TryGenerateFastBrOrCmTypeOf(IR::Instr *instr, IR::Instr **prev, bool isNeqOp, bool *pfNoLower)
{
    Assert(prev);
    Assert(instr->m_opcode == Js::OpCode::BrSrEq_A     ||
           instr->m_opcode == Js::OpCode::BrSrNeq_A    ||
           instr->m_opcode == Js::OpCode::BrSrNotEq_A  ||
           instr->m_opcode == Js::OpCode::BrSrNotNeq_A ||
           instr->m_opcode == Js::OpCode::CmSrEq_A     ||
           instr->m_opcode == Js::OpCode::CmSrNeq_A    ||
           instr->m_opcode == Js::OpCode::BrEq_A       ||
           instr->m_opcode == Js::OpCode::BrNeq_A      ||
           instr->m_opcode == Js::OpCode::BrNotEq_A    ||
           instr->m_opcode == Js::OpCode::BrNotNeq_A   ||
           instr->m_opcode == Js::OpCode::CmEq_A       ||
           instr->m_opcode == Js::OpCode::CmNeq_A);

    //
    // instr         - (Br/Cm)(Sr)(N(ot))eq_A
    // instr->m_prev - typeOf
    //
    IR::Instr *instrLd = instr->GetPrevRealInstrOrLabel();
    bool skippedLoads = false;
    //Skip intermediate Ld_A which might be inserted by flow graph peeps
    while (instrLd && instrLd->m_opcode == Js::OpCode::Ld_A )
    {
        if (!(instrLd->GetDst()->IsRegOpnd() && instrLd->GetDst()->AsRegOpnd()->m_fgPeepTmp))
        {
            return false;
        }
        if (instrLd->HasBailOutInfo())
        {
            return false;
        }
        instrLd = instrLd->GetPrevRealInstrOrLabel();
        skippedLoads = true;
    }

    IR::Instr *typeOf = instrLd;

    IR::RegOpnd *instrSrc1 = instr->GetSrc1()->IsRegOpnd() ? instr->GetSrc1()->AsRegOpnd() : nullptr;
    IR::RegOpnd *instrSrc2 = instr->GetSrc2()->IsRegOpnd() ? instr->GetSrc2()->AsRegOpnd() : nullptr;
    if (typeOf && (typeOf->m_opcode == Js::OpCode::Typeof))
    {
        IR::RegOpnd *typeOfDst = typeOf->GetDst()->IsRegOpnd() ? typeOf->GetDst()->AsRegOpnd() : nullptr;

        if (typeOfDst && instrSrc1 && instrSrc2)
        {
            do
            {
                IR::RegOpnd *typeOpnd = nullptr;
                IR::RegOpnd *idOpnd = nullptr;
                if (instrSrc1->m_sym == typeOfDst->m_sym)
                {
                    typeOpnd = instrSrc1;
                    idOpnd = instrSrc2;
                }
                else if (instrSrc2->m_sym == typeOfDst->m_sym)
                {
                    typeOpnd = instrSrc2;
                    idOpnd = instrSrc1;
                }
                else
                {
                    // Neither source turned out to be the typeOpnd
                    break;
                }

                if (!typeOpnd->m_isTempLastUse)
                {
                    break;
                }

                if (!(idOpnd->m_sym->m_isSingleDef && idOpnd->m_sym->m_isStrConst))
                {
                    return false;
                }

                // The second argument to [Cm|Br]TypeOf is the typeid.
                IR::IntConstOpnd *typeIdOpnd = nullptr;

                Assert(idOpnd->m_sym->m_isSingleDef);
                Assert(idOpnd->m_sym->m_instrDef->GetSrc1()->IsAddrOpnd());

                // We can't optimize non-javascript type strings.
                JITJavascriptString *typeNameJsString = JITJavascriptString::FromVar(idOpnd->m_sym->m_instrDef->GetSrc1()->AsAddrOpnd()->m_localAddress);
                const char16        *typeName = typeNameJsString->GetString();

                Js::InternalString typeNameString(typeName, typeNameJsString->GetLength());
                if (Js::InternalStringComparer::Equals(typeNameString, Js::Type::UndefinedTypeNameString))
                {
                    typeIdOpnd = IR::IntConstOpnd::New(Js::TypeIds_Undefined, TyInt32, instr->m_func);
                }
                else if (Js::InternalStringComparer::Equals(typeNameString, Js::Type::ObjectTypeNameString))
                {
                    typeIdOpnd = IR::IntConstOpnd::New(Js::TypeIds_Object, TyInt32, instr->m_func);
                }
                else if (Js::InternalStringComparer::Equals(typeNameString, Js::Type::BooleanTypeNameString))
                {
                    typeIdOpnd = IR::IntConstOpnd::New(Js::TypeIds_Boolean, TyInt32, instr->m_func);
                }
                else if (Js::InternalStringComparer::Equals(typeNameString, Js::Type::NumberTypeNameString))
                {
                    typeIdOpnd = IR::IntConstOpnd::New(Js::TypeIds_Number, TyInt32, instr->m_func);
                }
                else if (Js::InternalStringComparer::Equals(typeNameString, Js::Type::StringTypeNameString))
                {
                    typeIdOpnd = IR::IntConstOpnd::New(Js::TypeIds_String, TyInt32, instr->m_func);
                }
                else if (Js::InternalStringComparer::Equals(typeNameString, Js::Type::FunctionTypeNameString))
                {
                    typeIdOpnd = IR::IntConstOpnd::New(Js::TypeIds_Function, TyInt32, instr->m_func);
                }
                else
                {
                    return false;
                }

                if (skippedLoads)
                {
                    //validate none of dst of Ld_A overlaps with typeof src or dst
                    IR::Opnd* typeOfSrc = typeOf->GetSrc1();
                    instrLd = typeOf->GetNextRealInstr();
                    while (instrLd != instr)
                    {
                        if (instrLd->GetDst()->IsEqual(typeOfDst) || instrLd->GetDst()->IsEqual(typeOfSrc))
                        {
                            return false;
                        }
                        instrLd = instrLd->GetNextRealInstr();
                    }
                    typeOf->Unlink();
                    instr->InsertBefore(typeOf);
                }
                // The first argument to [Cm|Br]TypeOf is the first arg to the TypeOf instruction.
                IR::Opnd *objectOpnd = typeOf->GetSrc1();
                Assert(objectOpnd->IsRegOpnd());

                // Now emit this instruction and remove the ldstr and typeOf.
                *prev = typeOf->m_prev;
                *pfNoLower = false;
                if (instr->IsBranchInstr())
                {
                    GenerateFastBrTypeOf(instr, objectOpnd->AsRegOpnd(), typeIdOpnd, typeOf, pfNoLower, isNeqOp);
                }
                else
                {
                    GenerateFastCmTypeOf(instr, objectOpnd->AsRegOpnd(), typeIdOpnd, typeOf, pfNoLower, isNeqOp);
                }

                return true;
            } while (false);
        }
    }

    if (instrSrc1 && instrSrc1->GetStackSym()->IsSingleDef() && instrSrc2 && instrSrc2->GetStackSym()->IsSingleDef() &&
        (
            ((instrSrc1->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::Typeof) &&
                ((instrSrc2->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::Typeof) || instrSrc2->GetStackSym()->GetIsStrConst()))
            ||
            ((instrSrc2->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::Typeof) &&
                ((instrSrc1->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::Typeof) || instrSrc1->GetStackSym()->GetIsStrConst()))
            )
        )
    {
        *pfNoLower = true;
        if (instr->IsBranchInstr())
        {
            InsertCompareBranch(instrSrc1, instrSrc2, isNeqOp ? Js::OpCode::BrNeq_A : Js::OpCode::BrEq_A, instr->AsBranchInstr()->GetTarget(), instr);
            instr->Remove();
        }
        else
        {
            if (instrSrc1->IsEqual(instrSrc2))
            {
                InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, isNeqOp ? LibraryValue::ValueFalse : LibraryValue::ValueTrue), instr);
            }
            else
            {
                // t1 = typeof o1
                // t2 = typeof o2
                // dst = t1 == t2

                // MOV dst, true
                // CMP t1, t2

                // x86, amd64
                // CMOVNE dst, false

                // arm
                // BEQ $done
                // MOV dst, false
                // $done

                if (instr->GetDst()->IsEqual(instrSrc1))
                {
                    IR::Instr* hoistInstr = m_lowererMD.ChangeToAssign(instr->HoistSrc1(Js::OpCode::Ld_A));
                    instrSrc1 = hoistInstr->GetDst()->AsRegOpnd();
                }
                if (instr->GetDst()->IsEqual(instrSrc2))
                {
                    IR::Instr* hoistInstr = m_lowererMD.ChangeToAssign(instr->HoistSrc2(Js::OpCode::Ld_A));
                    instrSrc2 = hoistInstr->GetDst()->AsRegOpnd();
                }

                InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, LibraryValue::ValueTrue), instr);

#if defined(_M_ARM32_OR_ARM64)
                IR::LabelInstr * doneLabel = IR::LabelInstr::New(Js::OpCode::Label, instr->m_func);
                InsertCompareBranch(instrSrc1, instrSrc2, isNeqOp ? Js::OpCode::BrNeq_A : Js::OpCode::BrEq_A, doneLabel, instr);
                InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, LibraryValue::ValueFalse), instr);
                instr->InsertBefore(doneLabel);
#else
                InsertCompare(instrSrc1, instrSrc2, instr);
                LowererMD::InsertCmovCC(isNeqOp ? Js::OpCode::CMOVE : Js::OpCode::CMOVNE, instr->GetDst(), LoadLibraryValueOpnd(instr, LibraryValue::ValueFalse), instr);
#endif
            }
            instr->Remove();
        }
        return true;
    }

    return false;
}